

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set_test.cc
# Opt level: O0

void __thiscall
phmap::priv::anon_unknown_0::Table_CopyConstructWithAlloc_Test::~Table_CopyConstructWithAlloc_Test
          (Table_CopyConstructWithAlloc_Test *this)

{
  Table_CopyConstructWithAlloc_Test *this_local;
  
  ~Table_CopyConstructWithAlloc_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Table, CopyConstructWithAlloc) {
  StringTable t;
  t.emplace("a", "b");
  EXPECT_EQ(1, t.size());
  StringTable u(t, Alloc<std::pair<std::string, std::string>>());
  EXPECT_EQ(1, u.size());
  EXPECT_THAT(*u.find("a"), Pair("a", "b"));
}